

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::
~TransientCmdPoolRecycler(TransientCmdPoolRecycler *this)

{
  VulkanLogicalDevice *this_00;
  VkCommandPool_T *Pool;
  TransientCmdPoolRecycler *this_local;
  
  if (this->CmdPoolMgr != (CommandPoolManager *)0x0) {
    this_00 = this->LogicalDevice;
    Pool = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                     ((VulkanObjectWrapper *)&this->Pool);
    VulkanUtilities::VulkanLogicalDevice::FreeCommandBuffer(this_00,Pool,this->vkCmdBuffer);
    CommandPoolManager::RecycleCommandPool(this->CmdPoolMgr,&this->Pool);
  }
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper(&this->Pool);
  return;
}

Assistant:

~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }